

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.h
# Opt level: O2

string * __thiscall
beagle::plugin::Plugin::pluginType_abi_cxx11_(string *__return_storage_ptr__,Plugin *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_plugin_type);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string pluginType() const{ return m_plugin_type; }